

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::Option::ignore_case<CLI::App>(Option *this,bool value)

{
  bool bVar1;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *this_00;
  pointer pOVar2;
  ulong uVar3;
  OptionAlreadyAdded *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string *local_48;
  string *omatch;
  Option_p *opt;
  iterator __end0;
  iterator __begin0;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range3;
  App *parent;
  bool value_local;
  Option *this_local;
  
  if ((((this->super_OptionBase<CLI::Option>).ignore_case_ & 1U) == 0) && (value)) {
    (this->super_OptionBase<CLI::Option>).ignore_case_ = value;
    this_00 = &this->parent_->options_;
    __end0 = std::
             vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ::begin(this_00);
    opt = (Option_p *)
          std::
          vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                       *)&opt), bVar1) {
      omatch = (string *)
               __gnu_cxx::
               __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
               ::operator*(&__end0);
      pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                         ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)omatch);
      if (pOVar2 != this) {
        pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)omatch);
        local_48 = matching_name_abi_cxx11_(pOVar2,this);
        uVar3 = ::std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          (this->super_OptionBase<CLI::Option>).ignore_case_ = false;
          this_01 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
          ::std::operator+(&local_68,"adding ignore case caused a name conflict with ",local_48);
          OptionAlreadyAdded::OptionAlreadyAdded(this_01,&local_68);
          __cxa_throw(this_01,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded)
          ;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
      ::operator++(&__end0);
    }
  }
  else {
    (this->super_OptionBase<CLI::Option>).ignore_case_ = value;
  }
  return this;
}

Assistant:

Option *ignore_case(bool value = true) {
        if(!ignore_case_ && value) {
            ignore_case_ = value;
            auto *parent = static_cast<T *>(parent_);
            for(const Option_p &opt : parent->options_) {
                if(opt.get() == this) {
                    continue;
                }
                auto &omatch = opt->matching_name(*this);
                if(!omatch.empty()) {
                    ignore_case_ = false;
                    throw OptionAlreadyAdded("adding ignore case caused a name conflict with " + omatch);
                }
            }
        } else {
            ignore_case_ = value;
        }
        return this;
    }